

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.c
# Opt level: O2

LY_ERR lyht_find_rec(ly_ht *ht,void *val_p,uint32_t hash,ly_bool mod,lyht_value_equal_cb val_equal,
                    uint32_t *col,ly_ht_rec **rec_p)

{
  ly_bool lVar1;
  uint32_t uVar2;
  LY_ERR LVar3;
  ly_ht_rec *plVar4;
  
  uVar2 = ht->size;
  if (col != (uint32_t *)0x0) {
    *col = 0;
  }
  uVar2 = ht->hlists[uVar2 - 1 & hash].first;
  plVar4 = (ly_ht_rec *)(ht->recs + ht->rec_size * uVar2);
  do {
    if (uVar2 == 0xffffffff) {
      plVar4 = (ly_ht_rec *)0x0;
      LVar3 = LY_ENOTFOUND;
LAB_0011174d:
      *rec_p = plVar4;
      return LVar3;
    }
    if (plVar4->hash == hash) {
      lVar1 = (*val_equal)(val_p,plVar4->val,mod,ht->cb_data);
      if (lVar1 != '\0') {
        LVar3 = LY_SUCCESS;
        goto LAB_0011174d;
      }
    }
    if (col != (uint32_t *)0x0) {
      *col = *col + 1;
    }
    uVar2 = plVar4->next;
    plVar4 = (ly_ht_rec *)(ht->recs + ht->rec_size * uVar2);
  } while( true );
}

Assistant:

static LY_ERR
lyht_find_rec(const struct ly_ht *ht, void *val_p, uint32_t hash, ly_bool mod, lyht_value_equal_cb val_equal,
        uint32_t *col, struct ly_ht_rec **rec_p)
{
    uint32_t hlist_idx = hash & (ht->size - 1);
    struct ly_ht_rec *rec;
    uint32_t rec_idx;

    if (col) {
        *col = 0;
    }

    LYHT_ITER_HLIST_RECS(ht, hlist_idx, rec_idx, rec) {
        if ((rec->hash == hash) && val_equal(val_p, &rec->val, mod, ht->cb_data)) {
            *rec_p = rec;
            return LY_SUCCESS;
        }

        if (col) {
            *col = *col + 1;
        }
    }

    /* not found even in collisions */
    *rec_p = NULL;
    return LY_ENOTFOUND;
}